

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colStrBuf.c
# Opt level: O0

size_t Col_StringBufferLength(Col_Word strbuf)

{
  size_t sVar1;
  uint local_1c;
  uint local_18;
  uint local_14;
  Col_Word local_10;
  Col_Word strbuf_local;
  
  if (strbuf == 0) {
    local_14 = 0;
  }
  else {
    if ((strbuf & 0xf) == 0) {
      if ((*(byte *)strbuf & 2) == 0) {
        local_1c = 0xffffffff;
      }
      else {
        local_1c = *(byte *)strbuf & 0xfffffffe;
      }
      local_18 = local_1c;
    }
    else {
      local_18 = immediateWordTypes[strbuf & 0x1f];
    }
    local_14 = local_18;
  }
  local_10 = strbuf;
  if ((local_14 == 2) && ((*(ushort *)(strbuf + 2) & 0xc) == 0)) {
    local_10 = *(Col_Word *)(strbuf + 0x10);
  }
  sVar1 = Col_RopeLength(*(Col_Word *)(local_10 + 8));
  return sVar1 + *(long *)(local_10 + 0x10);
}

Assistant:

size_t
Col_StringBufferLength(
    Col_Word strbuf)    /*!< String buffer to get length for. */
{
    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_STRBUF,strbuf} */
    TYPECHECK_STRBUF(strbuf) return 0;

    WORD_UNWRAP(strbuf);

    /*
     * String buffer length is the cumulated string length plus the current
     * length of the character buffer.
     */

    return Col_RopeLength(WORD_STRBUF_ROPE(strbuf))
            + WORD_STRBUF_LENGTH(strbuf);
}